

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  uint *puVar1;
  int iVar2;
  wchar_t wVar3;
  
  if ((0xffff < this->_VtxCurrentIdx + vtx_count) && ((this->Flags & 8) != 0)) {
    (this->_CmdHeader).VtxOffset = (this->VtxBuffer).Size;
    _OnChangedVtxOffset(this);
  }
  puVar1 = &(this->CmdBuffer).Data[(long)(this->CmdBuffer).Size + -1].ElemCount;
  *puVar1 = *puVar1 + idx_count;
  iVar2 = (this->VtxBuffer).Size;
  ImVector<ImDrawVert>::resize(&this->VtxBuffer,vtx_count + iVar2);
  this->_VtxWritePtr = (this->VtxBuffer).Data + iVar2;
  wVar3 = (this->IdxBuffer).Size;
  ImVector<unsigned_short>::resize((ImVector<unsigned_short> *)&this->IdxBuffer,idx_count + wVar3);
  this->_IdxWritePtr = (this->IdxBuffer).Data + wVar3;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    // Large mesh support (when enabled)
    IM_ASSERT_PARANOID(idx_count >= 0 && vtx_count >= 0);
    if (sizeof(ImDrawIdx) == 2 && (_VtxCurrentIdx + vtx_count >= (1 << 16)) && (Flags & ImDrawListFlags_AllowVtxOffset))
    {
        // FIXME: In theory we should be testing that vtx_count <64k here.
        // In practice, RenderText() relies on reserving ahead for a worst case scenario so it is currently useful for us
        // to not make that check until we rework the text functions to handle clipping and large horizontal lines better.
        _CmdHeader.VtxOffset = VtxBuffer.Size;
        _OnChangedVtxOffset();
    }

    ImDrawCmd* draw_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    draw_cmd->ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}